

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void TrueMotion_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top,int size)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  unkuint9 Var15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [15];
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  long lVar25;
  short sVar26;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar27 [16];
  short sVar34;
  undefined1 auVar35 [16];
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  
  if (left == (uint8_t *)0x0) {
    if (top != (uint8_t *)0x0) {
      VerticalPred_SSE2(dst,top,size);
      return;
    }
    Fill_SSE2(dst,0x81,size);
    return;
  }
  if (top != (uint8_t *)0x0) {
    if (size == 8) {
      uVar1 = *(ulong *)top;
      auVar2._8_6_ = 0;
      auVar2._0_8_ = uVar1;
      auVar2[0xe] = (char)(uVar1 >> 0x38);
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar1;
      auVar4[0xc] = (char)(uVar1 >> 0x30);
      auVar4._13_2_ = auVar2._13_2_;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar1;
      auVar6._12_3_ = auVar4._12_3_;
      auVar8._8_2_ = 0;
      auVar8._0_8_ = uVar1;
      auVar8[10] = (char)(uVar1 >> 0x28);
      auVar8._11_4_ = auVar6._11_4_;
      auVar10._8_2_ = 0;
      auVar10._0_8_ = uVar1;
      auVar10._10_5_ = auVar8._10_5_;
      auVar12[8] = (char)(uVar1 >> 0x20);
      auVar12._0_8_ = uVar1;
      auVar12._9_6_ = auVar10._9_6_;
      auVar14._7_8_ = 0;
      auVar14._0_7_ = auVar12._8_7_;
      Var15 = CONCAT81(SUB158(auVar14 << 0x40,7),(char)(uVar1 >> 0x18));
      auVar21._9_6_ = 0;
      auVar21._0_9_ = Var15;
      auVar16._1_10_ = SUB1510(auVar21 << 0x30,5);
      auVar16[0] = (char)(uVar1 >> 0x10);
      auVar22._11_4_ = 0;
      auVar22._0_11_ = auVar16;
      auVar17._1_12_ = SUB1512(auVar22 << 0x20,3);
      auVar17[0] = (char)(uVar1 >> 8);
      for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
        auVar27 = pshuflw(ZEXT416((uint)left[lVar25] - (uint)left[-1]),
                          ZEXT416((uint)left[lVar25] - (uint)left[-1]),0);
        sVar33 = auVar27._0_2_;
        sVar26 = sVar33 + (ushort)(byte)uVar1;
        sVar34 = auVar27._2_2_;
        sVar28 = sVar34 + auVar17._0_2_;
        sVar29 = sVar33 + auVar16._0_2_;
        sVar30 = sVar34 + (short)Var15;
        sVar31 = sVar33 + auVar12._8_2_;
        sVar32 = sVar34 + auVar8._10_2_;
        sVar33 = sVar33 + auVar4._12_2_;
        sVar34 = sVar34 + (auVar2._13_2_ >> 8);
        *(ulong *)dst =
             CONCAT17((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34),
                      CONCAT16((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33),
                               CONCAT15((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 -
                                        (0xff < sVar32),
                                        CONCAT14((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 -
                                                 (0xff < sVar31),
                                                 CONCAT13((0 < sVar30) * (sVar30 < 0x100) *
                                                          (char)sVar30 - (0xff < sVar30),
                                                          CONCAT12((0 < sVar29) * (sVar29 < 0x100) *
                                                                   (char)sVar29 - (0xff < sVar29),
                                                                   CONCAT11((0 < sVar28) *
                                                                            (sVar28 < 0x100) *
                                                                            (char)sVar28 -
                                                                            (0xff < sVar28),
                                                                            (0 < sVar26) *
                                                                            (sVar26 < 0x100) *
                                                                            (char)sVar26 -
                                                                            (0xff < sVar26))))))));
        dst = dst + 0x20;
      }
    }
    else {
      auVar27 = *(undefined1 (*) [16])top;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar27._0_13_;
      auVar3[0xe] = auVar27[7];
      auVar5[0xc] = auVar27[6];
      auVar5._0_12_ = auVar27._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar27._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9[10] = auVar27[5];
      auVar9._0_10_ = auVar27._0_10_;
      auVar9._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar27._0_9_;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = auVar27[4];
      auVar13._0_8_ = auVar27._0_8_;
      auVar13._9_6_ = auVar11._9_6_;
      auVar18._7_8_ = 0;
      auVar18._0_7_ = auVar13._8_7_;
      Var15 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar27[3]);
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var15;
      auVar19._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar19[0] = auVar27[2];
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar19;
      auVar20._1_12_ = SUB1512(auVar24 << 0x20,3);
      auVar20[0] = auVar27[1];
      for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
        auVar35 = pshuflw(ZEXT416((uint)left[lVar25] - (uint)left[-1]),
                          ZEXT416((uint)left[lVar25] - (uint)left[-1]),0);
        sVar31 = auVar35._0_2_;
        sVar36 = sVar31 + (ushort)auVar27[0];
        sVar32 = auVar35._2_2_;
        sVar37 = sVar32 + auVar20._0_2_;
        sVar38 = sVar31 + auVar19._0_2_;
        sVar39 = sVar32 + (short)Var15;
        sVar40 = sVar31 + auVar13._8_2_;
        sVar41 = sVar32 + auVar9._10_2_;
        sVar42 = sVar31 + auVar5._12_2_;
        sVar43 = sVar32 + (auVar3._13_2_ >> 8);
        sVar33 = sVar31 + (ushort)auVar27[8];
        sVar26 = sVar32 + (ushort)auVar27[9];
        sVar34 = sVar31 + (ushort)auVar27[10];
        sVar28 = sVar32 + (ushort)auVar27[0xb];
        sVar29 = sVar31 + (ushort)auVar27[0xc];
        sVar30 = sVar32 + (ushort)auVar27[0xd];
        sVar31 = sVar31 + (ushort)auVar27[0xe];
        sVar32 = sVar32 + (ushort)auVar27[0xf];
        *dst = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
        dst[1] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        dst[2] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
        dst[3] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
        dst[4] = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
        dst[5] = (0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41);
        dst[6] = (0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42);
        dst[7] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
        dst[8] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        dst[9] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
        dst[10] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        dst[0xb] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        dst[0xc] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        dst[0xd] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        dst[0xe] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        dst[0xf] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        dst = dst + 0x20;
      }
    }
    return;
  }
  HorizontalPred_SSE2(dst,left,size);
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion_SSE2(uint8_t* dst, const uint8_t* left,
                                        const uint8_t* top, int size) {
  if (left != NULL) {
    if (top != NULL) {
      TM_SSE2(dst, left, top, size);
    } else {
      HorizontalPred_SSE2(dst, left, size);
    }
  } else {
    // true motion without left samples (hence: with default 129 value)
    // is equivalent to VE prediction where you just copy the top samples.
    // Note that if top samples are not available, the default value is
    // then 129, and not 127 as in the VerticalPred case.
    if (top != NULL) {
      VerticalPred_SSE2(dst, top, size);
    } else {
      Fill_SSE2(dst, 129, size);
    }
  }
}